

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O1

void __thiscall xe::ri::ImageSet::ImageSet(ImageSet *this)

{
  (this->super_Item).m_type = TYPE_IMAGESET;
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__ImageSet_0012e758;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  List::List(&this->images);
  return;
}

Assistant:

ImageSet		(void) : Item(TYPE_IMAGESET) {}